

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O3

bool __thiscall
CommandLineParser::isOption(CommandLineParser *this,string *shortName,string *longName)

{
  size_t sVar1;
  int iVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_60,"-",shortName);
  _Var3._M_p = local_60._M_dataplus._M_p;
  sVar1 = (this->m_option)._M_string_length;
  if ((sVar1 != local_60._M_string_length) ||
     ((bVar4 = true, sVar1 != 0 &&
      (iVar2 = bcmp((this->m_option)._M_dataplus._M_p,local_60._M_dataplus._M_p,sVar1), iVar2 != 0))
     )) {
    std::operator+(&local_40,"--",longName);
    sVar1 = (this->m_option)._M_string_length;
    if (sVar1 == local_40._M_string_length) {
      if (sVar1 == 0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp((this->m_option)._M_dataplus._M_p,local_40._M_dataplus._M_p,sVar1);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    _Var3._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      _Var3._M_p = local_60._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_60.field_2) {
    operator_delete(_Var3._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool 
CommandLineParser::isOption( const std::string &shortName,
                             const std::string &longName )
{
  return (m_option == "-" + shortName)  ||
         (m_option == "--" + longName);
}